

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O2

QString * standardLibraryErrorString(QString *__return_storage_ptr__,int errorCode)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  storage_type *in_RCX;
  char *sourceText;
  long in_FS_OFFSET;
  QByteArrayView ba;
  char *local_70;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  if (errorCode == 0) goto LAB_0029ef6e;
  if (errorCode == 2) {
    sourceText = "No such file or directory";
LAB_0029ef2b:
    QCoreApplication::translate((QString *)&local_58,"QIODevice",sourceText,(char *)0x0,-1);
  }
  else {
    if (errorCode == 0xd) {
      sourceText = "Permission denied";
      goto LAB_0029ef2b;
    }
    if (errorCode == 0x1c) {
      sourceText = "No space left on device";
      goto LAB_0029ef2b;
    }
    if (errorCode == 0x18) {
      sourceText = "Too many open files";
      goto LAB_0029ef2b;
    }
    local_70 = strerror(errorCode);
    QByteArrayView::QByteArrayView<char_*,_true>(&local_68,&local_70);
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)local_68.m_data;
    QString::fromLocal8Bit((QString *)&local_58,(QString *)local_68.m_size,ba);
  }
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  local_38.d = local_58.d;
  local_38.ptr = local_58.ptr;
  local_58.d = pDVar1;
  local_58.ptr = pcVar2;
  local_38.size = local_58.size;
  local_58.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0029ef6e:
  QString::trimmed_helper(__return_storage_ptr__,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString standardLibraryErrorString(int errorCode)
{
    const char *s = nullptr;
    QString ret;
    switch (errorCode) {
    case 0:
        break;
    case EACCES:
        s = QT_TRANSLATE_NOOP("QIODevice", "Permission denied");
        break;
    case EMFILE:
        s = QT_TRANSLATE_NOOP("QIODevice", "Too many open files");
        break;
    case ENOENT:
        s = QT_TRANSLATE_NOOP("QIODevice", "No such file or directory");
        break;
    case ENOSPC:
        s = QT_TRANSLATE_NOOP("QIODevice", "No space left on device");
        break;
    default: {
      #if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && _POSIX_VERSION >= 200112L && !defined(Q_OS_INTEGRITY) && !defined(Q_OS_QNX)
            QByteArray buf(1024, Qt::Uninitialized);
            ret = fromstrerror_helper(strerror_r(errorCode, buf.data(), buf.size()), buf);
      #else
            ret = QString::fromLocal8Bit(strerror(errorCode));
      #endif
    break; }
    }
    if (s) {
#ifndef QT_BOOTSTRAPPED
        ret = QCoreApplication::translate("QIODevice", s);
#else
        ret = QString::fromLatin1(s);
#endif
    }
    return ret.trimmed();
}